

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_query_node.cpp
# Opt level: O3

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::SetOperationNode::Deserialize(SetOperationNode *this,Deserializer *deserializer)

{
  SetOperationType setop_type;
  int iVar1;
  uint uVar2;
  _func_int **pp_Var3;
  SetOperationNode *this_00;
  QueryNode *pQVar4;
  undefined1 setop_all;
  type ret;
  string str;
  QueryNode *local_a0;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_98;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_90;
  vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
  local_88;
  undefined1 local_68 [16];
  pointer local_58;
  pointer local_48;
  pointer ppStack_40;
  pointer local_38;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"setop_type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_68,deserializer);
    setop_type = EnumUtil::FromString<duckdb::SetOperationType>((char *)local_68._0_8_);
    if ((QueryNode *)local_68._0_8_ != (QueryNode *)&stack0xffffffffffffffa8) {
      operator_delete((void *)local_68._0_8_);
    }
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    setop_type = (SetOperationType)iVar1;
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"left");
  if ((char)iVar1 == '\0') {
    local_a0 = (QueryNode *)0x0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      local_a0 = (QueryNode *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      QueryNode::Deserialize((QueryNode *)local_68,deserializer);
      local_a0 = (QueryNode *)local_68._0_8_;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"right");
  if ((char)iVar1 == '\0') {
    pQVar4 = (QueryNode *)0x0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      pQVar4 = (QueryNode *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      QueryNode::Deserialize((QueryNode *)local_68,deserializer);
      pQVar4 = (QueryNode *)local_68._0_8_;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcb,"setop_all");
  pp_Var3 = deserializer->_vptr_Deserializer;
  setop_all = true;
  if ((char)uVar2 != '\0') {
    iVar1 = (*pp_Var3[0xc])(deserializer);
    setop_all = (undefined1)iVar1;
    pp_Var3 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var3[5])(deserializer,(ulong)(uVar2 & 0xff));
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcc,"children");
  if ((char)iVar1 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_88.
    super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68._0_8_ = (QueryNode *)0x0;
    local_68._8_8_ = (pointer)0x0;
    local_58 = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
               *)local_68);
  }
  else {
    Deserializer::
    Read<duckdb::vector<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,true>>
              ((type *)&local_88,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  this_00 = (SetOperationNode *)operator_new(0x90);
  local_90._M_head_impl = local_a0;
  local_48 = local_88.
             super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppStack_40 = (pointer)local_88.
                        super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = (pointer)local_88.
                      super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.
  super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_head_impl = pQVar4;
  SetOperationNode(this_00,setop_type,
                   (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
                   &local_90,
                   (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
                   &local_98,
                   (vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
                    *)&stack0xffffffffffffffb8,(bool)setop_all);
  ::std::
  vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
             *)&stack0xffffffffffffffb8);
  if (local_98._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> *)
                        &(local_98._M_head_impl)->_vptr_QueryNode)->_M_t).
                       super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
                       .super__Head_base<0UL,_duckdb::QueryNode_*,_false> + 8))();
  }
  local_98._M_head_impl = (QueryNode *)0x0;
  if (local_90._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> *)
                        &(local_90._M_head_impl)->_vptr_QueryNode)->_M_t).
                       super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
                       .super__Head_base<0UL,_duckdb::QueryNode_*,_false> + 8))();
  }
  local_90._M_head_impl = (QueryNode *)0x0;
  (this->super_QueryNode)._vptr_QueryNode = (_func_int **)this_00;
  ::std::
  vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
  ::~vector(&local_88);
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)this;
}

Assistant:

unique_ptr<QueryNode> SetOperationNode::Deserialize(Deserializer &deserializer) {
	auto setop_type = deserializer.ReadProperty<SetOperationType>(200, "setop_type");
	auto left = deserializer.ReadPropertyWithDefault<unique_ptr<QueryNode>>(201, "left");
	auto right = deserializer.ReadPropertyWithDefault<unique_ptr<QueryNode>>(202, "right");
	auto setop_all = deserializer.ReadPropertyWithExplicitDefault<bool>(203, "setop_all", true);
	auto children = deserializer.ReadPropertyWithDefault<vector<unique_ptr<QueryNode>>>(204, "children");
	auto result = duckdb::unique_ptr<SetOperationNode>(new SetOperationNode(setop_type, std::move(left), std::move(right), std::move(children), setop_all));
	return std::move(result);
}